

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Runner2::Runner2(Runner2 *this,Config *configWrapper)

{
  ConfigData *pCVar1;
  Config *configWrapper_local;
  Runner2 *this_local;
  
  this->m_configWrapper = configWrapper;
  pCVar1 = Config::data(configWrapper);
  this->m_config = pCVar1;
  std::ofstream::ofstream(&this->m_ofs);
  Ptr<Catch::IReporter>::Ptr(&this->m_reporter);
  std::
  set<Catch::TestCaseInfo,_std::less<Catch::TestCaseInfo>,_std::allocator<Catch::TestCaseInfo>_>::
  set(&this->m_testsAlreadyRun);
  openStream(this);
  makeReporter(this);
  return;
}

Assistant:

Runner2( Config& configWrapper )
        :   m_configWrapper( configWrapper ),
            m_config( configWrapper.data() )
        {
            openStream();
            makeReporter();
        }